

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

int vkt::tessellation::referencePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *innerLevels,float *outerLevels)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000011;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int outer [3];
  int local_4c;
  int outer_3 [3];
  int iStack_3c;
  int inner;
  int local_2c;
  
  bVar1 = isPatchDiscarded(primitiveType,outerLevels);
  if ((int)CONCAT71(in_register_00000011,usePointMode) == 0) {
    iVar2 = 0;
    if (!bVar1) {
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        getClampedRoundedIsolineTessLevels(spacingMode,outerLevels,outer_3);
        iVar2 = outer_3[1] * outer_3[0];
      }
      else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
        getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_3);
        uVar7 = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
        while (outer[0] == 1 || outer[1] == 1) {
          if ((outer[0] == 1) &&
             (outer[1] == 1 &&
              (iStack_3c == 1 && (outer_3[2] == 1 && (outer_3[1] == 1 && outer_3[0] == 1))))) {
            return 2;
          }
          if (outer[0] < 2) {
            outer[0] = uVar7;
          }
          if (outer[1] < 2) {
            outer[1] = uVar7;
          }
        }
        iVar2 = (outer[1] - 1U) * (outer[0] * 2 + -4) +
                outer_3[0] + outer_3[1] + outer_3[2] + iStack_3c + outer[1] * 2 + -4;
      }
      else if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_3);
        iVar2 = 1;
        do {
          if (outer[0] != 1) {
            iVar4 = outer_3[1] + outer_3[0] + outer_3[2];
            iVar2 = outer[0] / 2;
            iVar3 = 0;
            if (iVar2 < 1) {
              iVar2 = 0;
            }
            iVar6 = outer[0] * 6;
            for (; iVar6 = iVar6 + -0xc, iVar2 * 2 != iVar3; iVar3 = iVar3 + 2) {
              iVar5 = iVar6;
              if (outer[0] - 3U == iVar3) {
                iVar5 = 4;
              }
              iVar4 = iVar4 + iVar5;
            }
            return iVar4;
          }
          outer[0] = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
        } while (outer_3[2] != 1 || (outer_3[1] != 1 || outer_3[0] != 1));
      }
    }
  }
  else {
    iVar2 = 0;
    if (!bVar1) {
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        getClampedRoundedIsolineTessLevels(spacingMode,outerLevels,outer);
        generateReferenceIsolineTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_3
                   ,outer[0],outer[1]);
      }
      else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
        getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
        generateReferenceQuadTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_3
                   ,spacingMode,inner,local_2c,outer[0],outer[1],outer[2],local_4c);
      }
      else {
        if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
          return 0;
        }
        getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
        generateReferenceTriangleTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_3
                   ,spacingMode,inner,outer[0],outer[1],outer[2]);
      }
      iVar2 = (int)((CONCAT44(iStack_3c,outer_3[2]) - CONCAT44(outer_3[1],outer_3[0])) / 0xc);
      std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
      ~_Vector_base((_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                    outer_3);
    }
  }
  return iVar2;
}

Assistant:

int referencePrimitiveCount (const TessPrimitiveType primitiveType, const SpacingMode spacingMode, const bool usePointMode, const float* innerLevels, const float* outerLevels)
{
	return usePointMode ? referencePointModePrimitiveCount		(primitiveType, spacingMode, innerLevels, outerLevels)
						: referenceNonPointModePrimitiveCount	(primitiveType, spacingMode, innerLevels, outerLevels);
}